

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * extraBddCountCubes(DdManager *dd,DdNode *L,DdNode *U,st__table *table,int *pnCubes,
                           int Limit)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  DdNode *pDVar4;
  uint *puVar5;
  DdNode *pDVar6;
  DdNode *n;
  DdNode *pDVar7;
  DdNode *n_00;
  DdNode *pDVar8;
  char *value;
  DdNode *pDVar9;
  DdNode *pDVar10;
  uint *puVar11;
  ulong uVar12;
  int Count2;
  int Count1;
  int Count0;
  int nCubes;
  DdNode *local_a8;
  int local_64;
  int local_60;
  int local_5c;
  DdNode *local_58;
  int local_4c;
  DdNode *local_48;
  int *local_40;
  ulong local_38;
  
  pDVar8 = dd->one;
  pDVar9 = (DdNode *)((ulong)pDVar8 ^ 1);
  local_5c = 0;
  local_60 = 0;
  local_64 = 0;
  if (pDVar9 == L) {
    *pnCubes = 0;
    return pDVar9;
  }
  if (pDVar8 == U) {
    *pnCubes = 1;
    return pDVar8;
  }
  local_40 = pnCubes;
  pDVar4 = cuddCacheLookup2(dd,cuddBddIsop,L,U);
  if (pDVar4 != (DdNode *)0x0) {
    local_4c = 0;
    iVar3 = st__lookup(table,(char *)pDVar4,(char **)&local_4c);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                    ,0x510,
                    "DdNode *extraBddCountCubes(DdManager *, DdNode *, DdNode *, st__table *, int *, int)"
                   );
    }
    *local_40 = local_4c;
    return pDVar4;
  }
  puVar11 = (uint *)((ulong)L & 0xfffffffffffffffe);
  uVar12 = (ulong)*puVar11;
  iVar3 = dd->perm[uVar12];
  puVar5 = (uint *)((ulong)U & 0xfffffffffffffffe);
  iVar1 = dd->perm[*puVar5];
  pDVar10 = L;
  local_38 = (ulong)*puVar5;
  pDVar4 = L;
  if (iVar3 <= iVar1) {
    pDVar4 = *(DdNode **)(puVar11 + 4);
    pDVar10 = *(DdNode **)(puVar11 + 6);
    local_38 = uVar12;
    if (((ulong)L & 1) != 0) {
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
      pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
    }
  }
  local_58 = U;
  local_48 = U;
  if (iVar1 <= iVar3) {
    local_48 = *(DdNode **)(puVar5 + 4);
    local_58 = *(DdNode **)(puVar5 + 6);
    if (((ulong)U & 1) != 0) {
      local_48 = (DdNode *)((ulong)local_48 ^ 1);
      local_58 = (DdNode *)((ulong)local_58 ^ 1);
    }
  }
  pDVar6 = cuddBddAndRecur(dd,pDVar10,(DdNode *)((ulong)local_48 ^ 1));
  if (pDVar6 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(pDVar6);
  pDVar7 = local_58;
  n = cuddBddAndRecur(dd,pDVar4,(DdNode *)((ulong)local_58 ^ 1));
  if (n == (DdNode *)0x0) goto LAB_007b8635;
  Cudd_Ref(n);
  pDVar7 = extraBddCountCubes(dd,pDVar6,pDVar7,table,&local_5c,Limit);
  if (pDVar7 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar6);
    pDVar6 = n;
    goto LAB_007b8635;
  }
  Cudd_Ref(pDVar7);
  n_00 = extraBddCountCubes(dd,n,local_48,table,&local_60,Limit);
  if (n_00 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar6);
    Cudd_RecursiveDeref(dd,n);
    pDVar6 = pDVar7;
    goto LAB_007b8635;
  }
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(dd,pDVar6);
  Cudd_RecursiveDeref(dd,n);
  pDVar6 = cuddBddAndRecur(dd,pDVar10,(DdNode *)((ulong)pDVar7 ^ 1));
  if (pDVar6 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar7);
    pDVar6 = n_00;
    goto LAB_007b8635;
  }
  Cudd_Ref(pDVar6);
  local_a8 = cuddBddAndRecur(dd,pDVar4,(DdNode *)((ulong)n_00 ^ 1));
  if (local_a8 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar7);
LAB_007b8664:
    Cudd_RecursiveDeref(dd,n_00);
  }
  else {
    Cudd_Ref(local_a8);
    pDVar4 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar6 ^ 1),(DdNode *)((ulong)local_a8 ^ 1));
    if (pDVar4 == (DdNode *)(ulong)(pDVar4 != (DdNode *)0x0)) {
      Cudd_RecursiveDeref(dd,pDVar7);
      Cudd_RecursiveDeref(dd,n_00);
      n_00 = pDVar6;
    }
    else {
      pDVar4 = (DdNode *)((ulong)(pDVar4 != (DdNode *)0x0) ^ (ulong)pDVar4);
      Cudd_Ref(pDVar4);
      pDVar10 = cuddBddAndRecur(dd,local_58,local_48);
      if (pDVar10 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar7);
        Cudd_RecursiveDeref(dd,n_00);
        Cudd_RecursiveDeref(dd,pDVar6);
        Cudd_RecursiveDeref(dd,local_a8);
        pDVar6 = pDVar4;
        goto LAB_007b8635;
      }
      Cudd_Ref(pDVar10);
      Cudd_RecursiveDeref(dd,pDVar6);
      Cudd_RecursiveDeref(dd,local_a8);
      local_a8 = extraBddCountCubes(dd,pDVar4,pDVar10,table,&local_64,Limit);
      if (local_a8 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar7);
        Cudd_RecursiveDeref(dd,n_00);
        n_00 = pDVar4;
        pDVar6 = pDVar10;
        goto LAB_007b8664;
      }
      Cudd_Ref(local_a8);
      Cudd_RecursiveDeref(dd,pDVar4);
      Cudd_RecursiveDeref(dd,pDVar10);
      pDVar8 = cuddUniqueInter(dd,(int)local_38,pDVar8,pDVar9);
      if (pDVar8 != (DdNode *)0x0) {
        Cudd_Ref(pDVar8);
        pDVar6 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar8 ^ 1),pDVar7);
        if (pDVar6 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar7);
          Cudd_RecursiveDeref(dd,n_00);
        }
        else {
          Cudd_Ref(pDVar6);
          Cudd_RecursiveDeref(dd,pDVar7);
          pDVar9 = cuddBddAndRecur(dd,pDVar8,n_00);
          if (pDVar9 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n_00);
            Cudd_RecursiveDeref(dd,local_a8);
            Cudd_RecursiveDeref(dd,pDVar8);
            goto LAB_007b8635;
          }
          local_58 = pDVar9;
          Cudd_Ref(pDVar9);
          Cudd_RecursiveDeref(dd,pDVar8);
          Cudd_RecursiveDeref(dd,n_00);
          pDVar9 = local_58;
          pDVar8 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar6 ^ 1),(DdNode *)((ulong)local_58 ^ 1))
          ;
          if (pDVar8 == (DdNode *)(ulong)(pDVar8 != (DdNode *)0x0)) {
            Cudd_RecursiveDeref(dd,local_a8);
            n_00 = pDVar6;
            pDVar6 = pDVar9;
            goto LAB_007b8664;
          }
          pDVar8 = (DdNode *)((ulong)(pDVar8 != (DdNode *)0x0) ^ (ulong)pDVar8);
          Cudd_Ref(pDVar8);
          Cudd_RecursiveDeref(dd,pDVar6);
          Cudd_RecursiveDeref(dd,pDVar9);
          pDVar6 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar8 ^ 1),(DdNode *)((ulong)local_a8 ^ 1))
          ;
          if (pDVar6 != (DdNode *)(ulong)(pDVar6 != (DdNode *)0x0)) {
            pDVar6 = (DdNode *)((ulong)(pDVar6 != (DdNode *)0x0) ^ (ulong)pDVar6);
            Cudd_Ref(pDVar6);
            Cudd_RecursiveDeref(dd,pDVar8);
            Cudd_RecursiveDeref(dd,local_a8);
            cuddCacheInsert2(dd,cuddBddIsop,L,U,pDVar6);
            piVar2 = local_40;
            value = (char *)((long)local_64 + (long)local_60 + (long)local_5c);
            *local_40 = (int)value;
            iVar3 = st__add_direct(table,(char *)pDVar6,value);
            if ((iVar3 != -10000) && (*piVar2 <= Limit)) {
              Cudd_Deref(pDVar6);
              return pDVar6;
            }
            goto LAB_007b8635;
          }
        }
        Cudd_RecursiveDeref(dd,local_a8);
        pDVar6 = pDVar8;
        goto LAB_007b8635;
      }
      Cudd_RecursiveDeref(dd,pDVar7);
    }
    Cudd_RecursiveDeref(dd,n_00);
    pDVar6 = local_a8;
  }
LAB_007b8635:
  Cudd_RecursiveDeref(dd,pDVar6);
  return (DdNode *)0x0;
}

Assistant:

static DdNode * extraBddCountCubes( DdManager * dd, DdNode * L, DdNode * U, st__table *table, int * pnCubes, int Limit )
{
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = Cudd_Not(one);
    int         v, top_l, top_u;
    DdNode      *Lsub0, *Usub0, *Lsub1, *Usub1, *Ld, *Ud;
    DdNode      *Lsuper0, *Usuper0, *Lsuper1, *Usuper1;
    DdNode      *Isub0, *Isub1, *Id;
    DdNode      *x;
    DdNode      *term0, *term1, *sum;
    DdNode      *Lv, *Uv, *Lnv, *Unv;
    DdNode      *r;
    int         index;
    int         Count0 = 0, Count1 = 0, Count2 = 0;

    statLine(dd);
    if (L == zero)
    {
        *pnCubes = 0;
        return(zero);
    }
    if (U == one)
    {
        *pnCubes = 1;
        return(one);
    }

    /* Check cache */
    r = cuddCacheLookup2(dd, cuddBddIsop, L, U);
    if (r)
    {
        int nCubes = 0;
        if ( st__lookup( table, (char *)r, (char **)&nCubes ) )
            *pnCubes = nCubes;
        else assert( 0 );
        return r;
    }

    top_l = dd->perm[Cudd_Regular(L)->index];
    top_u = dd->perm[Cudd_Regular(U)->index];
    v = ddMin(top_l, top_u);

    /* Compute cofactors */
    if (top_l == v) {
        index = Cudd_Regular(L)->index;
        Lv = Cudd_T(L);
        Lnv = Cudd_E(L);
        if (Cudd_IsComplement(L)) {
            Lv = Cudd_Not(Lv);
            Lnv = Cudd_Not(Lnv);
        }
    }
    else {
        index = Cudd_Regular(U)->index;
        Lv = Lnv = L;
    }

    if (top_u == v) {
        Uv = Cudd_T(U);
        Unv = Cudd_E(U);
        if (Cudd_IsComplement(U)) {
            Uv = Cudd_Not(Uv);
            Unv = Cudd_Not(Unv);
        }
    }
    else {
        Uv = Unv = U;
    }

    Lsub0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Uv));
    if (Lsub0 == NULL)
        return(NULL);
    Cudd_Ref(Lsub0);
    Usub0 = Unv;
    Lsub1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Unv));
    if (Lsub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        return(NULL);
    }
    Cudd_Ref(Lsub1);
    Usub1 = Uv;

    Isub0 = extraBddCountCubes(dd, Lsub0, Usub0, table, &Count0, Limit);
    if (Isub0 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        return(NULL);
    }
    Cudd_Ref(Isub0);
    Isub1 = extraBddCountCubes(dd, Lsub1, Usub1, table, &Count1, Limit);
    if (Isub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        Cudd_RecursiveDeref(dd, Isub0);
        return(NULL);
    }
    Cudd_Ref(Isub1);
    Cudd_RecursiveDeref(dd, Lsub0);
    Cudd_RecursiveDeref(dd, Lsub1);

    Lsuper0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Isub0));
    if (Lsuper0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        return(NULL);
    }
    Cudd_Ref(Lsuper0);
    Lsuper1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Isub1));
    if (Lsuper1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        return(NULL);
    }
    Cudd_Ref(Lsuper1);
    Usuper0 = Unv;
    Usuper1 = Uv;

    /* Ld = Lsuper0 + Lsuper1 */
    Ld = cuddBddAndRecur(dd, Cudd_Not(Lsuper0), Cudd_Not(Lsuper1));
    Ld = Cudd_NotCond(Ld, Ld != NULL);
    if (Ld == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        return(NULL);
    }
    Cudd_Ref(Ld);
    Ud = cuddBddAndRecur(dd, Usuper0, Usuper1);
    if (Ud == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        Cudd_RecursiveDeref(dd, Ld);
        return(NULL);
    }
    Cudd_Ref(Ud);
    Cudd_RecursiveDeref(dd, Lsuper0);
    Cudd_RecursiveDeref(dd, Lsuper1);

    Id = extraBddCountCubes(dd, Ld, Ud, table, &Count2, Limit);
    if (Id == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Ld);
        Cudd_RecursiveDeref(dd, Ud);
        return(NULL);
    }
    Cudd_Ref(Id);
    Cudd_RecursiveDeref(dd, Ld);
    Cudd_RecursiveDeref(dd, Ud);

    x = cuddUniqueInter(dd, index, one, zero);
    if (x == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        return(NULL);
    }
    Cudd_Ref(x);
    term0 = cuddBddAndRecur(dd, Cudd_Not(x), Isub0);
    if (term0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        return(NULL);
    }
    Cudd_Ref(term0);
    Cudd_RecursiveDeref(dd, Isub0);
    term1 = cuddBddAndRecur(dd, x, Isub1);
    if (term1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        Cudd_RecursiveDeref(dd, term0);
        return(NULL);
    }
    Cudd_Ref(term1);
    Cudd_RecursiveDeref(dd, x);
    Cudd_RecursiveDeref(dd, Isub1);
    /* sum = term0 + term1 */
    sum = cuddBddAndRecur(dd, Cudd_Not(term0), Cudd_Not(term1));
    sum = Cudd_NotCond(sum, sum != NULL);
    if (sum == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, term0);
        Cudd_RecursiveDeref(dd, term1);
        return(NULL);
    }
    Cudd_Ref(sum);
    Cudd_RecursiveDeref(dd, term0);
    Cudd_RecursiveDeref(dd, term1);
    /* r = sum + Id */
    r = cuddBddAndRecur(dd, Cudd_Not(sum), Cudd_Not(Id));
    r = Cudd_NotCond(r, r != NULL);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, sum);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDeref(dd, sum);
    Cudd_RecursiveDeref(dd, Id);

    cuddCacheInsert2(dd, cuddBddIsop, L, U, r);
    *pnCubes = Count0 + Count1 + Count2;
    if ( st__add_direct( table, (char *)r, (char *)(ABC_PTRINT_T)*pnCubes ) == st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( dd, r );
        return NULL;
    }
    if ( *pnCubes > Limit )
    {
        Cudd_RecursiveDeref( dd, r );
        return NULL;
    }
    //printf( "%d ", *pnCubes );
    Cudd_Deref(r);
    return r;
}